

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_reader_tests.cpp
# Opt level: O1

void check_parse_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  undefined1 *puVar1;
  byte bVar2;
  byte *pbVar3;
  pointer puVar4;
  undefined1 uVar5;
  semantic_tag sVar6;
  int iVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  byte *pbVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  pointer puVar10;
  json result;
  string s;
  AssertionHandler catchAssertionHandler_2;
  json j2;
  error_code ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  istringstream is;
  cbor_bytes_reader reader;
  undefined1 local_508 [16];
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_4f8;
  undefined1 local_4e8;
  undefined7 uStack_4e7;
  undefined1 local_4d8 [16];
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  pointer local_4c0;
  pointer piStack_4b8;
  pointer local_4b0;
  bool local_49e;
  pointer local_498;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_490;
  error_code local_480;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  cbor *local_450;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_448;
  json *local_438;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_430;
  StringRef local_3b0;
  StringRef local_3a0;
  StringRef local_390;
  undefined1 local_380 [64];
  IResultCapture *local_340;
  ios_base local_308 [264];
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> local_200;
  undefined **local_108;
  long *local_f0;
  long local_e0 [2];
  long *local_d0;
  long local_c0 [2];
  void *local_b0;
  long local_a0;
  long *local_98;
  long local_88 [2];
  long *local_78;
  long local_68 [2];
  long *local_58;
  long local_48 [2];
  item_event_visitor *local_38;
  
  local_480._M_value = 0;
  local_480._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_430,(allocator_type *)&local_200,(temp_allocator_type *)local_380);
  local_380._16_4_ = 0x400;
  local_380._0_8_ = jsoncons::cbor::cbor_decode_options::vtable + 0x18;
  local_380._8_8_ = 0xb5ba68;
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_reader<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>> *)&local_200,v,
             &local_430.super_basic_json_visitor<char>,(cbor_decode_options *)local_380,
             (allocator<char> *)local_4d8);
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            (&local_200);
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
            (&local_200,local_38,&local_480);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)local_508);
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_508,
                     expected);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v: ",3);
    pbVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pbVar9 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1) {
      bVar2 = *pbVar9;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      *(uint *)(remainder + *(long *)(std::cout + -0x18)) =
           *(uint *)(remainder + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<(&std::cout,(uint)bVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"result: ",8);
    pbVar8 = jsoncons::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                        (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        local_508);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"expected: ",10);
    pbVar8 = jsoncons::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,expected);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar8,"\n",1);
  }
  local_4d8._0_8_ = "REQUIRE";
  local_4d8._8_8_ = 7;
  local_460._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_460._8_8_ = (pointer)0x2f;
  Catch::StringRef::StringRef(&local_390,"result == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,(StringRef *)local_4d8,(SourceLineInfo *)local_460,
             local_390,Normal);
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_508,
                     expected);
  Catch::StringRef::StringRef((StringRef *)local_460,"==");
  local_4d8[9] = iVar7 == 0;
  local_4d8[8] = 1;
  local_4d8._0_8_ = &PTR_streamReconstructedExpression_00b59c50;
  local_4c0 = (pointer)local_460._0_8_;
  piStack_4b8 = (pointer)local_460._8_8_;
  _local_4c8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_508;
  local_4b0 = (pointer)expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_380,(ITransientExpression *)local_4d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  if ((bool)local_380[0x3a] == false) {
    (*local_340->_vptr_IResultCapture[0xe])();
  }
  local_4d8._0_8_ = "CHECK";
  local_4d8._8_8_ = 5;
  local_460._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_460._8_8_ = (pointer)0x30;
  Catch::StringRef::StringRef(&local_3a0,"result.tag() == expected.tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,(StringRef *)local_4d8,(SourceLineInfo *)local_460,
             local_3a0,ContinueOnFailure);
  sVar6 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_508);
  local_4f8._0_1_ = sVar6;
  sVar6 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag(expected);
  local_470[0] = sVar6;
  uVar5 = local_4f8._0_1_;
  Catch::StringRef::StringRef((StringRef *)local_460,"==");
  local_4d8[9] = uVar5 == sVar6;
  local_4d8[8] = 1;
  local_4d8._0_8_ = &PTR_streamReconstructedExpression_00b59fa0;
  local_4c0 = (pointer)local_460._0_8_;
  piStack_4b8 = (pointer)local_460._8_8_;
  _local_4c8 = local_508 + 0x10;
  local_4b0 = (pointer)local_470;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_380,(ITransientExpression *)local_4d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  if ((bool)local_380[0x3a] == false) {
    (*local_340->_vptr_IResultCapture[0xe])();
  }
  puVar1 = local_508 + 0x20;
  local_4f8.int64_.val_ = 0;
  local_4e8 = 0;
  puVar10 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_4f8._0_8_ = puVar1;
  if (puVar10 != puVar4) {
    do {
      std::__cxx11::string::push_back((char)local_508 + '\x10');
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar4);
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_380,(string *)(local_508 + 0x10),_S_in);
  local_4c8 = 0x400;
  local_4d8._0_8_ = jsoncons::cbor::cbor_decode_options::vtable + 0x18;
  local_4d8._8_8_ = 0xb5ba68;
  jsoncons::cbor::
  decode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((cbor *)&local_490,(istream *)local_380,(cbor_decode_options *)local_4d8);
  local_460._0_8_ = "REQUIRE";
  local_460._8_8_ = 7;
  local_470._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_470._8_8_ = 0x39;
  Catch::StringRef::StringRef(&local_3b0,"j2 == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_4d8,(StringRef *)local_460,(SourceLineInfo *)local_470,
             local_3b0,Normal);
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (&local_490,expected);
  Catch::StringRef::StringRef((StringRef *)local_470,"==");
  local_460[9] = iVar7 == 0;
  local_460[8] = 1;
  local_460._0_8_ = &PTR_streamReconstructedExpression_00b59c50;
  local_448._0_8_ = local_470._0_8_;
  local_448.int64_.val_ = local_470._8_8_;
  local_450 = (cbor *)&local_490;
  local_438 = expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_4d8,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::AssertionHandler::complete((AssertionHandler *)local_4d8);
  if (local_49e == false) {
    (**(code **)(*(long *)local_498 + 0x70))();
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_490);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_380);
  std::ios_base::~ios_base(local_308);
  if ((undefined1 *)local_4f8._0_8_ != puVar1) {
    operator_delete((void *)local_4f8._0_8_,CONCAT71(uStack_4e7,local_4e8) + 1);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_508);
  local_108 = &PTR__basic_item_event_visitor_to_json_visitor_00b58998;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b0 != (void *)0x0) {
    operator_delete(local_b0,local_a0 - (long)local_b0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
  ~basic_cbor_parser(&local_200);
  if (local_430.structure_stack_.
      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.structure_stack_.
                    super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.structure_stack_.
                          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.structure_stack_.
                          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~vector(&local_430.item_stack_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430.name_._M_dataplus._M_p != &local_430.name_.field_2) {
    operator_delete(local_430.name_._M_dataplus._M_p,
                    local_430.name_.field_2._M_allocated_capacity + 1);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            (&local_430.result_);
  return;
}

Assistant:

void check_parse_cbor(const std::vector<uint8_t>& v, const json& expected)
{
    JSONCONS_TRY
    {
        std::error_code ec;

        jsoncons::json_decoder<json> decoder;
        cbor_bytes_reader reader(v, decoder);
        reader.read(ec);

        json result = decoder.get_result();

        if (!(result == expected))
        {
            std::cout << "v: ";
            for (auto b : v)
            {
                std::cout << "0x" << std::hex << (int)b;
            }
            std::cout << "\n";
            std::cout << "result: " << result << "\n";
            std::cout << "expected: " << expected << "\n";
        }

        REQUIRE(result == expected);
        CHECK(result.tag() == expected.tag());

        std::string s;
        for (auto c : v)
        {
            s.push_back(c);
        }
        std::istringstream is(s);
        json j2 = decode_cbor<json>(is);
        REQUIRE(j2 == expected);
    }